

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

Value __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::
makeObject<jsonnet::internal::(anonymous_namespace)::HeapSimpleObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>>>,std::__cxx11::list<jsonnet::internal::AST*,std::allocator<jsonnet::internal::AST*>>>
          (Interpreter *this,
          map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
          *args,map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
                *args_1,
          list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *args_2)

{
  anon_union_8_3_4e909c26_for_v aVar1;
  Value VVar2;
  Value r;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_stack_00000038;
  Interpreter *in_stack_00000040;
  
  aVar1.h = (HeapEntity *)
            makeHeap<jsonnet::internal::(anonymous_namespace)::HeapSimpleObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>&,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>>>&,std::__cxx11::list<jsonnet::internal::AST*,std::allocator<jsonnet::internal::AST*>>&>
                      (in_stack_00000040,in_stack_00000038,r.v.h,
                       (list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
                       r._0_8_);
  VVar2.v.h = aVar1.h;
  VVar2._0_8_ = 0x12;
  return VVar2;
}

Assistant:

Value makeObject(Args... args)
    {
        Value r;
        r.t = Value::OBJECT;
        r.v.h = makeHeap<T>(args...);
        return r;
    }